

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::BuiltinPrecisionTests::intervalToString<tcu::Matrix<float,2,3>>
          (string *__return_storage_ptr__,BuiltinPrecisionTests *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  printIVal<tcu::Matrix<float,2,3>>((FloatFormat *)this,(IVal *)fmt,(ostream *)aoStack_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}